

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_graph.cpp
# Opt level: O3

ListGraph * load_pace_graph_impl(ListGraph *__return_storage_ptr__,istream *in)

{
  uint uVar1;
  ListGraph *pLVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  istream *piVar6;
  istream *piVar7;
  long *plVar8;
  runtime_error *prVar9;
  int iVar10;
  int iVar11;
  size_type *psVar12;
  long *plVar13;
  bool bVar14;
  int __val;
  int iVar15;
  int t;
  int h;
  string sp;
  string p;
  int arc_count;
  int node_count;
  string line;
  istringstream lin;
  uint local_2c8;
  int local_2c4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  int *local_280;
  int *local_278;
  ulong local_270;
  ListGraph *local_268;
  undefined1 local_260 [32];
  int *local_240;
  int local_238;
  int *local_230;
  int *local_228;
  int *local_220;
  int *local_218;
  string local_210;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  ios_base local_138 [264];
  
  (__return_storage_ptr__->head).super_ArrayIDFunc<int>.preimage_count_ = 0;
  (__return_storage_ptr__->head).super_ArrayIDFunc<int>.data_ = (int *)0x0;
  (__return_storage_ptr__->head).image_count_ = 0;
  (__return_storage_ptr__->tail).super_ArrayIDFunc<int>.preimage_count_ = 0;
  (__return_storage_ptr__->tail).super_ArrayIDFunc<int>.data_ = (int *)0x0;
  (__return_storage_ptr__->tail).image_count_ = 0;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  local_1d0._M_string_length = 0;
  local_1d0.field_2._M_local_buf[0] = '\0';
  local_220 = (int *)0x0;
  local_218 = (int *)0x0;
  iVar5 = 0;
  local_228 = (int *)0x0;
  local_230 = (int *)0x0;
  local_280 = (int *)0x0;
  local_278 = (int *)0x0;
  __val = 0;
  local_270 = 0;
  bVar14 = false;
  local_268 = __return_storage_ptr__;
  do {
    do {
      __val = __val + 1;
      cVar3 = std::ios::widen((char)*(undefined8 *)(*(long *)in + -0x18) + (char)in);
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (in,(string *)&local_1d0,cVar3);
      pLVar2 = local_268;
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) {
        if ((int)local_270 != iVar5) {
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::to_string(&local_1f0,iVar5);
          std::operator+(&local_2c0,"The arc count in the header (",&local_1f0);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_2c0);
          local_2a0._M_dataplus._M_p = (pointer)*plVar8;
          psVar12 = (size_type *)(plVar8 + 2);
          if ((size_type *)local_2a0._M_dataplus._M_p == psVar12) {
            local_2a0.field_2._M_allocated_capacity = *psVar12;
            local_2a0.field_2._8_8_ = plVar8[3];
            local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
          }
          else {
            local_2a0.field_2._M_allocated_capacity = *psVar12;
          }
          local_2a0._M_string_length = plVar8[1];
          *plVar8 = (long)psVar12;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::__cxx11::to_string(&local_210,(int)local_270);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_260,&local_2a0,&local_210);
          plVar8 = (long *)std::__cxx11::string::append(local_260);
          local_1b0 = (long *)*plVar8;
          plVar13 = plVar8 + 2;
          if (local_1b0 == plVar13) {
            local_1a0 = *plVar13;
            lStack_198 = plVar8[3];
            local_1b0 = &local_1a0;
          }
          else {
            local_1a0 = *plVar13;
          }
          local_1a8 = plVar8[1];
          *plVar8 = (long)plVar13;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::runtime_error::runtime_error(prVar9,(string *)&local_1b0);
          __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p);
        }
        return pLVar2;
      }
    } while ((local_1d0._M_string_length == 0) || (*local_1d0._M_dataplus._M_p == 'c'));
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&local_1b0,(string *)&local_1d0,_S_in);
    pLVar2 = local_268;
    if (bVar14) {
      piVar7 = (istream *)std::istream::operator>>((istream *)&local_1b0,(int *)&local_2c8);
      plVar8 = (long *)std::istream::operator>>(piVar7,&local_2c4);
      if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(&local_210,__val);
        std::operator+(&local_1f0,"Can not parse line num ",&local_210);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_1f0);
        local_2c0._M_dataplus._M_p = (pointer)*plVar8;
        psVar12 = (size_type *)(plVar8 + 2);
        if ((size_type *)local_2c0._M_dataplus._M_p == psVar12) {
          local_2c0.field_2._M_allocated_capacity = *psVar12;
          local_2c0.field_2._8_8_ = plVar8[3];
          local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
        }
        else {
          local_2c0.field_2._M_allocated_capacity = *psVar12;
        }
        local_2c0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::operator+(&local_2a0,&local_2c0,&local_1d0);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_2a0);
        local_260._0_8_ = *plVar8;
        psVar12 = (size_type *)(plVar8 + 2);
        if ((size_type *)local_260._0_8_ == psVar12) {
          local_260._16_8_ = *psVar12;
          local_260._24_8_ = plVar8[3];
          local_260._0_8_ = local_260 + 0x10;
        }
        else {
          local_260._16_8_ = *psVar12;
        }
        local_260._8_8_ = plVar8[1];
        *plVar8 = (long)psVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::runtime_error::runtime_error(prVar9,(string *)local_260);
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar10 = local_2c4 + -1;
      uVar4 = local_2c8 - 1;
      if (((local_2c4 < 1) || (uVar1 = (pLVar2->head).image_count_, (int)uVar1 < local_2c4)) ||
         (((int)local_2c8 < 1 || (uVar1 <= uVar4)))) {
        local_2c8 = uVar4;
        local_2c4 = iVar10;
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(&local_210,__val);
        std::operator+(&local_1f0,"Invalid arc in line num ",&local_210);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_1f0);
        local_2c0._M_dataplus._M_p = (pointer)*plVar8;
        psVar12 = (size_type *)(plVar8 + 2);
        if ((size_type *)local_2c0._M_dataplus._M_p == psVar12) {
          local_2c0.field_2._M_allocated_capacity = *psVar12;
          local_2c0.field_2._8_8_ = plVar8[3];
          local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
        }
        else {
          local_2c0.field_2._M_allocated_capacity = *psVar12;
        }
        local_2c0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::operator+(&local_2a0,&local_2c0,&local_1d0);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_2a0);
        local_260._0_8_ = *plVar8;
        psVar12 = (size_type *)(plVar8 + 2);
        if ((size_type *)local_260._0_8_ == psVar12) {
          local_260._16_8_ = *psVar12;
          local_260._24_8_ = plVar8[3];
          local_260._0_8_ = local_260 + 0x10;
        }
        else {
          local_260._16_8_ = *psVar12;
        }
        local_260._8_8_ = plVar8[1];
        *plVar8 = (long)psVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::runtime_error::runtime_error(prVar9,(string *)local_260);
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar15 = (int)local_270;
      if (iVar15 < iVar5) {
        local_230[iVar15] = iVar10;
        local_228[iVar15] = uVar4;
        iVar5 = (pLVar2->head).super_ArrayIDFunc<int>.preimage_count_;
        local_280 = local_228;
        local_278 = local_230;
      }
      iVar11 = iVar15 + 1;
      if (iVar11 < iVar5) {
        local_218[iVar11] = uVar4;
        local_220[iVar11] = iVar10;
        local_228 = local_220;
        local_230 = local_218;
        local_280 = local_220;
        local_278 = local_218;
      }
      local_270 = (ulong)(iVar15 + 2);
      local_2c8 = uVar4;
      local_2c4 = iVar10;
    }
    else {
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      local_2a0._M_string_length = 0;
      local_2a0.field_2._M_allocated_capacity =
           local_2a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
      local_2c0._M_string_length = 0;
      local_2c0.field_2._M_allocated_capacity =
           local_2c0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      piVar6 = std::operator>>((istream *)&local_1b0,(string *)&local_2a0);
      piVar6 = std::operator>>(piVar6,(string *)&local_2c0);
      piVar7 = (istream *)std::istream::operator>>((istream *)piVar6,(int *)&local_1f0);
      plVar8 = (long *)std::istream::operator>>(piVar7,(int *)&local_210);
      if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar9,"Can not parse header in pace file.");
LAB_00119d46:
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar5 = std::__cxx11::string::compare((char *)&local_2a0);
      if ((((iVar5 != 0) || (iVar5 = std::__cxx11::string::compare((char *)&local_2c0), iVar5 != 0))
          || ((int)local_1f0._M_dataplus._M_p < 0)) || ((int)local_210._M_dataplus._M_p < 0)) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar9,"Invalid header in pace file.");
        goto LAB_00119d46;
      }
      ListGraph::ListGraph
                ((ListGraph *)local_260,(int)local_1f0._M_dataplus._M_p,
                 (int)local_210._M_dataplus._M_p * 2);
      if (local_278 != (int *)0x0) {
        operator_delete__(local_278);
        local_280 = (pLVar2->tail).super_ArrayIDFunc<int>.data_;
      }
      iVar5 = local_260._0_4_;
      (pLVar2->head).super_ArrayIDFunc<int>.preimage_count_ = local_260._0_4_;
      local_260._0_8_ = local_260._0_8_ & 0xffffffff00000000;
      local_218 = (int *)local_260._8_8_;
      (pLVar2->head).super_ArrayIDFunc<int>.data_ = (int *)local_260._8_8_;
      local_260._8_8_ = (int *)0x0;
      (pLVar2->head).image_count_ = local_260._16_4_;
      if (local_280 != (int *)0x0) {
        operator_delete__(local_280);
      }
      (pLVar2->tail).super_ArrayIDFunc<int>.preimage_count_ = local_260._24_4_;
      local_260._24_8_ = local_260._24_8_ & 0xffffffff00000000;
      local_220 = local_240;
      (pLVar2->tail).super_ArrayIDFunc<int>.data_ = local_240;
      local_240 = (int *)0x0;
      (pLVar2->tail).image_count_ = local_238;
      if ((int *)local_260._8_8_ != (int *)0x0) {
        operator_delete__((void *)local_260._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p);
      }
      local_228 = local_220;
      local_230 = local_218;
      local_280 = local_220;
      local_278 = local_218;
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&local_1b0);
    std::ios_base::~ios_base(local_138);
    bVar14 = true;
  } while( true );
}

Assistant:

static ListGraph load_pace_graph_impl(std::istream& in)
{
    ListGraph graph;
    std::string line;
    int line_num = 0;
    int next_arc = 0;

    bool was_header_read = false;
    while (std::getline(in, line)) {
        ++line_num;
        if (line.empty() || line[0] == 'c')
            continue;

        std::istringstream lin(line);
        if (!was_header_read) {
            was_header_read = true;
            std::string p, sp;
            int node_count;
            int arc_count;
            if (!(lin >> p >> sp >> node_count >> arc_count))
                throw std::runtime_error("Can not parse header in pace file.");
            if (p != "p" || sp != "tdp" || node_count < 0 || arc_count < 0)
                throw std::runtime_error("Invalid header in pace file.");
            graph = ListGraph(node_count, 2 * arc_count);
        } else {
            int h, t;
            if (!(lin >> t >> h))
                throw std::runtime_error("Can not parse line num " + std::to_string(line_num) + " \"" + line + "\" in pace file.");
            --h;
            --t;
            if (h < 0 || h >= graph.node_count() || t < 0 || t >= graph.node_count())
                throw std::runtime_error("Invalid arc in line num " + std::to_string(line_num) + " \"" + line + "\" in pace file.");
            if (next_arc < graph.arc_count()) {
                graph.head[next_arc] = h;
                graph.tail[next_arc] = t;
            }
            ++next_arc;
            if (next_arc < graph.arc_count()) {
                graph.head[next_arc] = t;
                graph.tail[next_arc] = h;
            }
            ++next_arc;
        }
    }

    if (next_arc != graph.arc_count())
        throw std::runtime_error(
            "The arc count in the header (" + std::to_string(graph.arc_count()) + ") does not correspond with the actual number of arcs (" + std::to_string(next_arc) + ").");

    return graph; // NVRO
}